

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O0

JsonNull * __thiscall json::JsonDocument::setNullAsRoot(JsonDocument *this)

{
  JsonNull *pJVar1;
  type this_00;
  unique_ptr<json::JsonNull,_std::default_delete<json::JsonNull>_> local_18;
  JsonDocument *local_10;
  JsonDocument *this_local;
  
  local_10 = this;
  pJVar1 = (JsonNull *)operator_new(0x10);
  JsonNull::JsonNull(pJVar1);
  std::unique_ptr<json::JsonNull,std::default_delete<json::JsonNull>>::
  unique_ptr<std::default_delete<json::JsonNull>,void>
            ((unique_ptr<json::JsonNull,std::default_delete<json::JsonNull>> *)&local_18,pJVar1);
  std::unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>>::operator=
            ((unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *)this,&local_18);
  std::unique_ptr<json::JsonNull,_std::default_delete<json::JsonNull>_>::~unique_ptr(&local_18);
  this_00 = std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::operator*
                      (&this->root);
  pJVar1 = JsonNode::operator_cast_to_JsonNull_(this_00);
  return pJVar1;
}

Assistant:

JsonNull &JsonDocument::setNullAsRoot()
    {
        root = std::unique_ptr<JsonNull>(new JsonNull());
        return *root;
    }